

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

uintmax_t ghc::filesystem::remove_all(path *p,error_code *ec)

{
  bool bVar1;
  int iVar2;
  file_type fVar3;
  uint uVar4;
  error_category *peVar5;
  uintmax_t uVar6;
  uintmax_t *in_RCX;
  format fmt;
  time_t *in_R8;
  ulong uVar8;
  directory_iterator iter;
  error_code tec;
  file_status fs;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [16];
  directory_iterator local_48;
  int local_38;
  undefined8 uVar7;
  
  peVar5 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar5;
  local_68._M_allocated_capacity = (size_type)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"/","");
  uVar7 = local_68._M_allocated_capacity;
  local_88._0_8_ = (impl *)(local_88 + 0x10);
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)local_88,local_68._M_allocated_capacity,
             (undefined1 *)(local_68._8_8_ + local_68._M_allocated_capacity));
  fmt = (format)uVar7;
  if ((undefined1 *)local_68._M_allocated_capacity != local_58) {
    operator_delete((void *)local_68._M_allocated_capacity);
  }
  path::postprocess_path_with_format((path *)local_88,fmt);
  iVar2 = path::compare(p,(path *)local_88);
  if ((impl *)local_88._0_8_ != (impl *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  if (iVar2 == 0) {
    ec->_M_value = 0x5f;
    ec->_M_cat = peVar5;
    return 0xffffffffffffffff;
  }
  local_68._M_allocated_capacity = local_68._M_allocated_capacity & 0xffffffff00000000;
  local_68._8_8_ = peVar5;
  detail::symlink_status_ex
            ((path *)&local_38,(error_code *)p,&local_68._M_allocated_capacity,in_RCX,in_R8);
  if (local_38 == 3) {
    directory_iterator::directory_iterator((directory_iterator *)local_88,p,ec);
    uVar8 = 0;
    while( true ) {
      directory_iterator::directory_iterator(&local_48);
      iVar2 = path::compare((path *)(local_88._0_8_ + 0x38),
                            &((local_48._impl.
                               super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_dir_entry)._path);
      if (local_48._impl.
          super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48._impl.
                   super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      bVar1 = true;
      if (((iVar2 == 0) || (0x14 < (uint)ec->_M_value)) ||
         ((0x100005U >> (ec->_M_value & 0x1fU) & 1) == 0)) goto LAB_00164581;
      bVar1 = directory_entry::is_symlink((directory_entry *)(local_88._0_8_ + 0x38),ec);
      if (ec->_M_value == 0) {
        if ((bVar1) ||
           (fVar3 = directory_entry::status_file_type((directory_entry *)(local_88._0_8_ + 0x38),ec)
           , fVar3 != directory)) {
          if (ec->_M_value == 0) {
            remove((filesystem *)(local_88._0_8_ + 0x38),(char *)ec);
          }
          bVar1 = ec->_M_value == 0;
          uVar8 = uVar8 + bVar1;
        }
        else {
          uVar6 = remove_all((path *)(local_88._0_8_ + 0x38),ec);
          uVar8 = uVar8 + uVar6;
          bVar1 = ec->_M_value == 0;
        }
      }
      else {
        bVar1 = false;
      }
      if (!bVar1) break;
      directory_iterator::impl::increment((impl *)local_88._0_8_,ec);
    }
    bVar1 = false;
LAB_00164581:
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    if (!bVar1) {
      return 0xffffffffffffffff;
    }
  }
  else {
    uVar8 = 0;
  }
  if (ec->_M_value == 0) {
    uVar4 = remove((filesystem *)p,(char *)ec);
    uVar8 = uVar8 + (uVar4 & 0xff);
  }
  return -(ulong)(ec->_M_value != 0) | uVar8;
}

Assistant:

GHC_INLINE uintmax_t remove_all(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
    uintmax_t count = 0;
    if (p == "/") {
        ec = detail::make_error_code(detail::portable_error::not_supported);
        return static_cast<uintmax_t>(-1);
    }
    std::error_code tec;
    auto fs = symlink_status(p, tec);
    if (exists(fs) && is_directory(fs)) {
        for (auto iter = directory_iterator(p, ec); iter != directory_iterator(); iter.increment(ec)) {
            if (ec && !detail::is_not_found_error(ec)) {
                break;
            }
            bool is_symlink_result = iter->is_symlink(ec);
            if (ec)
                return static_cast<uintmax_t>(-1);
            if (!is_symlink_result && iter->is_directory(ec)) {
                count += remove_all(iter->path(), ec);
                if (ec) {
                    return static_cast<uintmax_t>(-1);
                }
            }
            else {
                if (!ec) {
                    remove(iter->path(), ec);
                }
                if (ec) {
                    return static_cast<uintmax_t>(-1);
                }
                ++count;
            }
        }
    }
    if (!ec) {
        if (remove(p, ec)) {
            ++count;
        }
    }
    if (ec) {
        return static_cast<uintmax_t>(-1);
    }
    return count;
}